

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KrazyMeans.cpp
# Opt level: O0

void __thiscall KrazyMeans::dumpLabels(KrazyMeans *this,string *file_name)

{
  size_t sVar1;
  reference pvVar2;
  string *in_RSI;
  long in_RDI;
  size_t v;
  ofstream file;
  size_type local_218;
  char local_210 [528];
  
  std::ofstream::ofstream(local_210,in_RSI,_S_bin);
  local_218 = 0;
  while( true ) {
    std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x10bb20);
    sVar1 = DataSet::size((DataSet *)0x10bb28);
    if (sVar1 <= local_218) break;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),
                        local_218);
    std::ostream::write(local_210,(long)pvVar2);
    local_218 = local_218 + 1;
  }
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void KrazyMeans::dumpLabels(std::string file_name) {
  std::ofstream file(file_name, std::ios::binary);

  // Write labels as uint16_t
  for (size_t v = 0; v < data_set->size(); v++) {
    file.write((char *) &labels[v], sizeof(size_t));
  }
}